

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_listener.cpp
# Opt level: O1

void __thiscall zmq::ipc_listener_t::in_event(ipc_listener_t *this)

{
  in_event((ipc_listener_t *)
           (this[-1].super_stream_listener_base_t.super_own_t.options.routing_id + 0x67));
  return;
}

Assistant:

void zmq::ipc_listener_t::in_event ()
{
    const fd_t fd = accept ();

    //  If connection was reset by the peer in the meantime, just ignore it.
    //  TODO: Handle specific errors like ENFILE/EMFILE etc.
    if (fd == retired_fd) {
        _socket->event_accept_failed (
          make_unconnected_bind_endpoint_pair (_endpoint), zmq_errno ());
        return;
    }

    //  Create the engine object for this connection.
    create_engine (fd);
}